

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_disasm.cpp
# Opt level: O3

string * disassemble_spirv_abi_cxx11_
                   (string *__return_storage_ptr__,VulkanDevice *device,VkPipeline pipeline,
                   DisasmMethod method,VkShaderStageFlagBits stage,
                   VkShaderModuleCreateInfo *module_create_info,char *entry_point)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  long lVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  size_t sVar7;
  char cVar8;
  bool bVar9;
  spvc_result sVar10;
  VkResult VVar11;
  ulong uVar12;
  ulong uVar13;
  string *extraout_RAX;
  string *extraout_RAX_00;
  size_type *psVar14;
  string *extraout_RAX_01;
  string *extraout_RAX_02;
  string *extraout_RAX_03;
  string *extraout_RAX_04;
  void *pvVar15;
  string *psVar16;
  string *extraout_RAX_05;
  string *extraout_RAX_06;
  string *extraout_RAX_07;
  string *extraout_RAX_08;
  uint uVar17;
  VkPipelineExecutablePropertiesKHR *pVVar18;
  ulong uVar19;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar20;
  uint uVar21;
  SpvExecutionModel model;
  VkPipelineExecutableInternalRepresentationKHR *rep;
  char cVar22;
  pointer pVVar23;
  VkPipeline pVVar24;
  VkPipelineExecutableInternalRepresentationKHR *pVVar25;
  pointer pVVar26;
  iterator __end4;
  VkPipelineExecutableStatisticKHR *stat;
  IVariant **ppIVar27;
  pointer pVVar28;
  VkPipelineExecutableInternalRepresentationKHR *rep_1;
  Variant *pVVar29;
  undefined4 uVar30;
  undefined4 uVar37;
  undefined1 auVar32 [16];
  int iVar38;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  int iVar43;
  undefined1 auVar42 [16];
  spvc_parsed_ir ir;
  spvc_context ctx;
  char *output;
  vector<VkPipelineExecutableStatisticKHR,_std::allocator<VkPipelineExecutableStatisticKHR>_>
  statistics;
  spvc_compiler_options opts;
  spvc_compiler comp;
  uint32_t local_ec;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  VectorView<spirv_cross::Variant> local_a8;
  long local_98;
  vector<VkPipelineExecutableStatisticKHR,_std::allocator<VkPipelineExecutableStatisticKHR>_>
  local_88;
  vector<VkPipelineExecutablePropertiesKHR,_std::allocator<VkPipelineExecutablePropertiesKHR>_>
  local_70;
  VkPipelineInfoKHR local_58;
  pointer local_38;
  undefined1 auVar31 [16];
  
  if (method == ISA) {
    if (device->pipeline_stats == true) {
      local_ec = 0;
      local_58._0_8_ = (spvc_compiler)0x3b9ee4c9;
      local_58.pNext = (void *)0x0;
      local_58.pipeline = pipeline;
      VVar11 = (*vkGetPipelineExecutablePropertiesKHR)
                         (device->device,&local_58,&local_ec,
                          (VkPipelineExecutablePropertiesKHR *)0x0);
      if (VVar11 != VK_SUCCESS) {
LAB_0013a5b9:
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        __return_storage_ptr__->_M_string_length = 0;
        (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
        return (string *)&__return_storage_ptr__->field_2;
      }
      std::
      vector<VkPipelineExecutablePropertiesKHR,_std::allocator<VkPipelineExecutablePropertiesKHR>_>
      ::vector(&local_70,(ulong)local_ec,(allocator_type *)local_c8);
      auVar6 = _DAT_003a4040;
      auVar5 = _DAT_003a4030;
      auVar4 = _DAT_003a4020;
      if (local_70.
          super__Vector_base<VkPipelineExecutablePropertiesKHR,_std::allocator<VkPipelineExecutablePropertiesKHR>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_70.
          super__Vector_base<VkPipelineExecutablePropertiesKHR,_std::allocator<VkPipelineExecutablePropertiesKHR>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        uVar12 = (long)local_70.
                       super__Vector_base<VkPipelineExecutablePropertiesKHR,_std::allocator<VkPipelineExecutablePropertiesKHR>_>
                       ._M_impl.super__Vector_impl_data._M_finish +
                 (-0x218 - (long)local_70.
                                 super__Vector_base<VkPipelineExecutablePropertiesKHR,_std::allocator<VkPipelineExecutablePropertiesKHR>_>
                                 ._M_impl.super__Vector_impl_data._M_start);
        auVar42._8_8_ = 0;
        auVar42._0_8_ = uVar12;
        uVar30 = SUB164(auVar42 * ZEXT816(0xf4898d5f85bb3951),8);
        uVar37 = (undefined4)(uVar12 / 0x10c000000);
        auVar31._0_8_ = CONCAT44(uVar37,uVar30);
        auVar31._8_4_ = uVar30;
        auVar31._12_4_ = uVar37;
        auVar32._0_8_ = auVar31._0_8_ >> 9;
        auVar32._8_8_ = auVar31._8_8_ >> 9;
        uVar13 = 0;
        auVar32 = auVar32 ^ _DAT_003a4040;
        pVVar23 = local_70.
                  super__Vector_base<VkPipelineExecutablePropertiesKHR,_std::allocator<VkPipelineExecutablePropertiesKHR>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        do {
          auVar39._8_4_ = (int)uVar13;
          auVar39._0_8_ = uVar13;
          auVar39._12_4_ = (int)(uVar13 >> 0x20);
          auVar42 = (auVar39 | auVar5) ^ auVar6;
          iVar38 = auVar32._4_4_;
          if ((bool)(~(iVar38 < auVar42._4_4_ ||
                      auVar32._0_4_ < auVar42._0_4_ && auVar42._4_4_ == iVar38) & 1)) {
            pVVar23->sType = VK_STRUCTURE_TYPE_PIPELINE_EXECUTABLE_PROPERTIES_KHR;
          }
          if (auVar42._12_4_ <= auVar32._12_4_ &&
              (auVar42._8_4_ <= auVar32._8_4_ || auVar42._12_4_ != auVar32._12_4_)) {
            pVVar23[1].sType = VK_STRUCTURE_TYPE_PIPELINE_EXECUTABLE_PROPERTIES_KHR;
          }
          auVar42 = (auVar39 | auVar4) ^ auVar6;
          iVar43 = auVar42._4_4_;
          if (iVar43 <= iVar38 && (iVar43 != iVar38 || auVar42._0_4_ <= auVar32._0_4_)) {
            pVVar23[2].sType = VK_STRUCTURE_TYPE_PIPELINE_EXECUTABLE_PROPERTIES_KHR;
            pVVar23[3].sType = VK_STRUCTURE_TYPE_PIPELINE_EXECUTABLE_PROPERTIES_KHR;
          }
          uVar13 = uVar13 + 4;
          pVVar23 = pVVar23 + 4;
        } while ((uVar12 / 0x218 + 4 & 0xfffffffffffffffc) != uVar13);
      }
      VVar11 = (*vkGetPipelineExecutablePropertiesKHR)
                         (device->device,&local_58,&local_ec,
                          local_70.
                          super__Vector_base<VkPipelineExecutablePropertiesKHR,_std::allocator<VkPipelineExecutablePropertiesKHR>_>
                          ._M_impl.super__Vector_impl_data._M_start);
      if (VVar11 == VK_SUCCESS) {
        if ((ulong)local_ec != 0) {
          paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)&(local_70.
                         super__Vector_base<VkPipelineExecutablePropertiesKHR,_std::allocator<VkPipelineExecutablePropertiesKHR>_>
                         ._M_impl.super__Vector_impl_data._M_start)->stages;
          uVar12 = 0;
LAB_0013a63c:
          if ((*(VkShaderStageFlagBits *)paVar20 & stage) == 0) goto code_r0x0013a641;
          local_c8._0_8_ = (VkPipelineExecutablePropertiesKHR *)0x3b9ee4cb;
          local_c8._8_8_ = (pointer)0x0;
          local_b8._8_8_ = uVar12 & 0xffffffff;
          local_a8.ptr = (Variant *)0x0;
          local_a8.buffer_size = 0;
          local_98 = 0;
          local_b8._0_8_ = pipeline;
          VVar11 = (*vkGetPipelineExecutableInternalRepresentationsKHR)
                             (device->device,(VkPipelineExecutableInfoKHR *)local_c8,&local_ec,
                              (VkPipelineExecutableInternalRepresentationKHR *)0x0);
          if (VVar11 == VK_SUCCESS) {
            std::
            vector<VkPipelineExecutableInternalRepresentationKHR,_std::allocator<VkPipelineExecutableInternalRepresentationKHR>_>
            ::resize((vector<VkPipelineExecutableInternalRepresentationKHR,_std::allocator<VkPipelineExecutableInternalRepresentationKHR>_>
                      *)&local_a8,(ulong)local_ec);
            auVar6 = _DAT_003a4040;
            auVar5 = _DAT_003a4030;
            auVar4 = _DAT_003a4020;
            if (local_a8.ptr != (Variant *)local_a8.buffer_size) {
              uVar12 = local_a8.buffer_size + (-0x228 - (long)local_a8.ptr);
              auVar1._8_8_ = 0;
              auVar1._0_8_ = uVar12;
              uVar30 = SUB164(auVar1 * ZEXT816(0xed7303b5cc0ed731),8);
              uVar37 = (undefined4)(uVar12 / 0x114000000);
              auVar33._0_8_ = CONCAT44(uVar37,uVar30);
              auVar33._8_4_ = uVar30;
              auVar33._12_4_ = uVar37;
              auVar34._0_8_ = auVar33._0_8_ >> 9;
              auVar34._8_8_ = auVar33._8_8_ >> 9;
              uVar13 = 0;
              auVar34 = auVar34 ^ _DAT_003a4040;
              pVVar25 = (VkPipelineExecutableInternalRepresentationKHR *)local_a8.ptr;
              do {
                auVar40._8_4_ = (int)uVar13;
                auVar40._0_8_ = uVar13;
                auVar40._12_4_ = (int)(uVar13 >> 0x20);
                auVar42 = (auVar40 | auVar5) ^ auVar6;
                iVar38 = auVar34._4_4_;
                if ((bool)(~(iVar38 < auVar42._4_4_ ||
                            auVar34._0_4_ < auVar42._0_4_ && auVar42._4_4_ == iVar38) & 1)) {
                  pVVar25->sType = VK_STRUCTURE_TYPE_PIPELINE_EXECUTABLE_INTERNAL_REPRESENTATION_KHR
                  ;
                }
                if (auVar42._12_4_ <= auVar34._12_4_ &&
                    (auVar42._8_4_ <= auVar34._8_4_ || auVar42._12_4_ != auVar34._12_4_)) {
                  pVVar25[1].sType =
                       VK_STRUCTURE_TYPE_PIPELINE_EXECUTABLE_INTERNAL_REPRESENTATION_KHR;
                }
                auVar42 = (auVar40 | auVar4) ^ auVar6;
                iVar43 = auVar42._4_4_;
                if (iVar43 <= iVar38 && (iVar43 != iVar38 || auVar42._0_4_ <= auVar34._0_4_)) {
                  pVVar25[2].sType =
                       VK_STRUCTURE_TYPE_PIPELINE_EXECUTABLE_INTERNAL_REPRESENTATION_KHR;
                  pVVar25[3].sType =
                       VK_STRUCTURE_TYPE_PIPELINE_EXECUTABLE_INTERNAL_REPRESENTATION_KHR;
                }
                uVar13 = uVar13 + 4;
                pVVar25 = pVVar25 + 4;
              } while ((uVar12 / 0x228 + 4 & 0xfffffffffffffffc) != uVar13);
            }
            VVar11 = (*vkGetPipelineExecutableInternalRepresentationsKHR)
                               (device->device,(VkPipelineExecutableInfoKHR *)local_c8,&local_ec,
                                (VkPipelineExecutableInternalRepresentationKHR *)local_a8.ptr);
            pVVar29 = local_a8.ptr;
            sVar7 = local_a8.buffer_size;
            pVVar25 = (VkPipelineExecutableInternalRepresentationKHR *)local_a8.ptr;
            if (VVar11 == VK_SUCCESS) {
              for (; pVVar25 != (VkPipelineExecutableInternalRepresentationKHR *)sVar7;
                  pVVar25 = pVVar25 + 1) {
                pvVar15 = malloc(pVVar25->dataSize);
                pVVar25->pData = pvVar15;
              }
              VVar11 = (*vkGetPipelineExecutableInternalRepresentationsKHR)
                                 (device->device,(VkPipelineExecutableInfoKHR *)local_c8,&local_ec,
                                  (VkPipelineExecutableInternalRepresentationKHR *)pVVar29);
              if (VVar11 != VK_SUCCESS) {
                sVar7 = local_a8.buffer_size;
                pVVar29 = local_a8.ptr;
                if (local_a8.ptr != (Variant *)local_a8.buffer_size) {
                  do {
                    free(*(void **)&pVVar29[0x16].type);
                    pVVar29 = pVVar29 + 0x17;
                  } while (pVVar29 != (Variant *)sVar7);
                  pVVar25 = (VkPipelineExecutableInternalRepresentationKHR *)local_a8.ptr;
                  goto LAB_0013a827;
                }
              }
            }
            else {
LAB_0013a827:
              if ((VkPipelineExecutableInternalRepresentationKHR *)local_a8.buffer_size != pVVar25)
              {
                local_a8.buffer_size = (size_t)pVVar25;
              }
            }
          }
          local_88.
          super__Vector_base<VkPipelineExecutableStatisticKHR,_std::allocator<VkPipelineExecutableStatisticKHR>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_88.
          super__Vector_base<VkPipelineExecutableStatisticKHR,_std::allocator<VkPipelineExecutableStatisticKHR>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_88.
          super__Vector_base<VkPipelineExecutableStatisticKHR,_std::allocator<VkPipelineExecutableStatisticKHR>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          VVar11 = (*vkGetPipelineExecutableStatisticsKHR)
                             (device->device,(VkPipelineExecutableInfoKHR *)local_c8,&local_ec,
                              (VkPipelineExecutableStatisticKHR *)0x0);
          if (VVar11 == VK_SUCCESS) {
            std::
            vector<VkPipelineExecutableStatisticKHR,_std::allocator<VkPipelineExecutableStatisticKHR>_>
            ::resize(&local_88,(ulong)local_ec);
            auVar6 = _DAT_003a4040;
            auVar5 = _DAT_003a4030;
            auVar4 = _DAT_003a4020;
            if (local_88.
                super__Vector_base<VkPipelineExecutableStatisticKHR,_std::allocator<VkPipelineExecutableStatisticKHR>_>
                ._M_impl.super__Vector_impl_data._M_start !=
                local_88.
                super__Vector_base<VkPipelineExecutableStatisticKHR,_std::allocator<VkPipelineExecutableStatisticKHR>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
              uVar12 = (long)local_88.
                             super__Vector_base<VkPipelineExecutableStatisticKHR,_std::allocator<VkPipelineExecutableStatisticKHR>_>
                             ._M_impl.super__Vector_impl_data._M_finish +
                       (-0x220 - (long)local_88.
                                       super__Vector_base<VkPipelineExecutableStatisticKHR,_std::allocator<VkPipelineExecutableStatisticKHR>_>
                                       ._M_impl.super__Vector_impl_data._M_start);
              auVar2._8_8_ = 0;
              auVar2._0_8_ = uVar12;
              uVar30 = SUB164(auVar2 * ZEXT816(0xf0f0f0f0f0f0f0f1),8);
              uVar37 = (undefined4)(uVar12 / 0x110000000);
              auVar35._0_8_ = CONCAT44(uVar37,uVar30);
              auVar35._8_4_ = uVar30;
              auVar35._12_4_ = uVar37;
              auVar36._0_8_ = auVar35._0_8_ >> 9;
              auVar36._8_8_ = auVar35._8_8_ >> 9;
              uVar13 = 0;
              auVar36 = auVar36 ^ _DAT_003a4040;
              pVVar26 = local_88.
                        super__Vector_base<VkPipelineExecutableStatisticKHR,_std::allocator<VkPipelineExecutableStatisticKHR>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              do {
                auVar41._8_4_ = (int)uVar13;
                auVar41._0_8_ = uVar13;
                auVar41._12_4_ = (int)(uVar13 >> 0x20);
                auVar42 = (auVar41 | auVar5) ^ auVar6;
                iVar38 = auVar36._4_4_;
                if ((bool)(~(auVar42._4_4_ == iVar38 && auVar36._0_4_ < auVar42._0_4_ ||
                            iVar38 < auVar42._4_4_) & 1)) {
                  pVVar26->sType = VK_STRUCTURE_TYPE_PIPELINE_EXECUTABLE_INTERNAL_REPRESENTATION_KHR
                  ;
                }
                if ((auVar42._12_4_ != auVar36._12_4_ || auVar42._8_4_ <= auVar36._8_4_) &&
                    auVar42._12_4_ <= auVar36._12_4_) {
                  pVVar26[1].sType =
                       VK_STRUCTURE_TYPE_PIPELINE_EXECUTABLE_INTERNAL_REPRESENTATION_KHR;
                }
                auVar42 = (auVar41 | auVar4) ^ auVar6;
                iVar43 = auVar42._4_4_;
                if (iVar43 <= iVar38 && (iVar43 != iVar38 || auVar42._0_4_ <= auVar36._0_4_)) {
                  pVVar26[2].sType =
                       VK_STRUCTURE_TYPE_PIPELINE_EXECUTABLE_INTERNAL_REPRESENTATION_KHR;
                  pVVar26[3].sType =
                       VK_STRUCTURE_TYPE_PIPELINE_EXECUTABLE_INTERNAL_REPRESENTATION_KHR;
                }
                uVar13 = uVar13 + 4;
                pVVar26 = pVVar26 + 4;
              } while ((uVar12 / 0x220 + 4 & 0xfffffffffffffffc) != uVar13);
            }
            VVar11 = (*vkGetPipelineExecutableStatisticsKHR)
                               (device->device,(VkPipelineExecutableInfoKHR *)local_c8,&local_ec,
                                local_88.
                                super__Vector_base<VkPipelineExecutableStatisticKHR,_std::allocator<VkPipelineExecutableStatisticKHR>_>
                                ._M_impl.super__Vector_impl_data._M_start);
            if (VVar11 != VK_SUCCESS) {
              if (local_88.
                  super__Vector_base<VkPipelineExecutableStatisticKHR,_std::allocator<VkPipelineExecutableStatisticKHR>_>
                  ._M_impl.super__Vector_impl_data._M_finish !=
                  local_88.
                  super__Vector_base<VkPipelineExecutableStatisticKHR,_std::allocator<VkPipelineExecutableStatisticKHR>_>
                  ._M_impl.super__Vector_impl_data._M_start) {
                local_88.
                super__Vector_base<VkPipelineExecutableStatisticKHR,_std::allocator<VkPipelineExecutableStatisticKHR>_>
                ._M_impl.super__Vector_impl_data._M_finish =
                     local_88.
                     super__Vector_base<VkPipelineExecutableStatisticKHR,_std::allocator<VkPipelineExecutableStatisticKHR>_>
                     ._M_impl.super__Vector_impl_data._M_start;
              }
            }
          }
          psVar16 = (string *)&__return_storage_ptr__->field_2;
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)psVar16;
          __return_storage_ptr__->_M_string_length = 0;
          (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
          sVar7 = local_a8.buffer_size;
          if (local_a8.ptr != (Variant *)local_a8.buffer_size) {
            ppIVar27 = &local_a8.ptr[0xb].holder;
            do {
              if (*(int *)(ppIVar27 + 0x20) != 0) {
                std::__cxx11::string::append((char *)__return_storage_ptr__);
                std::__cxx11::string::append((char *)__return_storage_ptr__);
                std::__cxx11::string::append((char *)__return_storage_ptr__);
                std::__cxx11::string::append((char *)__return_storage_ptr__);
                std::__cxx11::string::append((char *)__return_storage_ptr__);
                std::__cxx11::string::append((char *)__return_storage_ptr__);
                std::__cxx11::string::append((char *)__return_storage_ptr__);
              }
              free(ppIVar27[0x22]);
              psVar16 = (string *)(ppIVar27 + 0x45);
              lVar3 = (long)(ppIVar27 + 0x23);
              ppIVar27 = (IVariant **)psVar16;
            } while (lVar3 != sVar7);
          }
          if (local_88.
              super__Vector_base<VkPipelineExecutableStatisticKHR,_std::allocator<VkPipelineExecutableStatisticKHR>_>
              ._M_impl.super__Vector_impl_data._M_start !=
              local_88.
              super__Vector_base<VkPipelineExecutableStatisticKHR,_std::allocator<VkPipelineExecutableStatisticKHR>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            paVar20 = &local_e8.field_2;
            local_38 = local_88.
                       super__Vector_base<VkPipelineExecutableStatisticKHR,_std::allocator<VkPipelineExecutableStatisticKHR>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            pVVar26 = local_88.
                      super__Vector_base<VkPipelineExecutableStatisticKHR,_std::allocator<VkPipelineExecutableStatisticKHR>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            pVVar28 = local_88.
                      super__Vector_base<VkPipelineExecutableStatisticKHR,_std::allocator<VkPipelineExecutableStatisticKHR>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            do {
              std::__cxx11::string::append((char *)__return_storage_ptr__);
              std::__cxx11::string::append((char *)__return_storage_ptr__);
              std::__cxx11::string::append((char *)__return_storage_ptr__);
              std::__cxx11::string::append((char *)__return_storage_ptr__);
              switch(pVVar28->format) {
              case VK_PIPELINE_EXECUTABLE_STATISTIC_FORMAT_BOOL32_KHR:
                uVar21 = (pVVar28->value).b32;
                cVar22 = '\x01';
                if (9 < uVar21) {
                  uVar17 = uVar21;
                  cVar8 = '\x04';
                  do {
                    cVar22 = cVar8;
                    if (uVar17 < 100) {
                      cVar22 = cVar22 + -2;
                      goto LAB_0013ace2;
                    }
                    if (uVar17 < 1000) {
                      cVar22 = cVar22 + -1;
                      goto LAB_0013ace2;
                    }
                    if (uVar17 < 10000) goto LAB_0013ace2;
                    bVar9 = 99999 < uVar17;
                    uVar17 = uVar17 / 10000;
                    cVar8 = cVar22 + '\x04';
                  } while (bVar9);
                  cVar22 = cVar22 + '\x01';
                }
LAB_0013ace2:
                local_e8._M_dataplus._M_p = (pointer)paVar20;
                std::__cxx11::string::_M_construct((ulong)&local_e8,cVar22);
                std::__detail::__to_chars_10_impl<unsigned_int>
                          (local_e8._M_dataplus._M_p,(uint)local_e8._M_string_length,uVar21);
                std::__cxx11::string::_M_append
                          ((char *)__return_storage_ptr__,(ulong)local_e8._M_dataplus._M_p);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_e8._M_dataplus._M_p != paVar20) {
                  operator_delete(local_e8._M_dataplus._M_p,
                                  local_e8.field_2._M_allocated_capacity + 1);
                }
                break;
              case VK_PIPELINE_EXECUTABLE_STATISTIC_FORMAT_INT64_KHR:
                uVar12 = (pVVar28->value).u64;
                uVar13 = -uVar12;
                if (0 < (long)uVar12) {
                  uVar13 = uVar12;
                }
                uVar21 = 1;
                if (9 < uVar13) {
                  uVar19 = uVar13;
                  uVar17 = 4;
                  do {
                    uVar21 = uVar17;
                    if (uVar19 < 100) {
                      uVar21 = uVar21 - 2;
                      goto LAB_0013ad3c;
                    }
                    if (uVar19 < 1000) {
                      uVar21 = uVar21 - 1;
                      goto LAB_0013ad3c;
                    }
                    if (uVar19 < 10000) goto LAB_0013ad3c;
                    bVar9 = 99999 < uVar19;
                    uVar19 = uVar19 / 10000;
                    uVar17 = uVar21 + 4;
                  } while (bVar9);
                  uVar21 = uVar21 + 1;
                }
LAB_0013ad3c:
                local_e8._M_dataplus._M_p = (pointer)paVar20;
                std::__cxx11::string::_M_construct
                          ((ulong)&local_e8,(char)uVar21 - (char)((long)uVar12 >> 0x3f));
                std::__detail::__to_chars_10_impl<unsigned_long>
                          (local_e8._M_dataplus._M_p + -((long)uVar12 >> 0x3f),uVar21,uVar13);
                std::__cxx11::string::_M_append
                          ((char *)__return_storage_ptr__,(ulong)local_e8._M_dataplus._M_p);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_e8._M_dataplus._M_p != paVar20) {
                  operator_delete(local_e8._M_dataplus._M_p,
                                  local_e8.field_2._M_allocated_capacity + 1);
                }
                std::__cxx11::string::append((char *)__return_storage_ptr__);
                snprintf((char *)&local_e8,0x11,"%016llx",(pVVar28->value).i64);
                std::__cxx11::string::append((char *)__return_storage_ptr__);
                pVVar26 = local_38;
                break;
              case VK_PIPELINE_EXECUTABLE_STATISTIC_FORMAT_UINT64_KHR:
                uVar12 = (pVVar28->value).u64;
                cVar22 = '\x01';
                if (9 < uVar12) {
                  uVar13 = uVar12;
                  cVar8 = '\x04';
                  do {
                    cVar22 = cVar8;
                    if (uVar13 < 100) {
                      cVar22 = cVar22 + -2;
                      goto LAB_0013ac52;
                    }
                    if (uVar13 < 1000) {
                      cVar22 = cVar22 + -1;
                      goto LAB_0013ac52;
                    }
                    if (uVar13 < 10000) goto LAB_0013ac52;
                    bVar9 = 99999 < uVar13;
                    uVar13 = uVar13 / 10000;
                    cVar8 = cVar22 + '\x04';
                  } while (bVar9);
                  cVar22 = cVar22 + '\x01';
                }
LAB_0013ac52:
                local_e8._M_dataplus._M_p = (pointer)paVar20;
                std::__cxx11::string::_M_construct((ulong)&local_e8,cVar22);
                std::__detail::__to_chars_10_impl<unsigned_long>
                          (local_e8._M_dataplus._M_p,(uint)local_e8._M_string_length,uVar12);
                std::__cxx11::string::_M_append
                          ((char *)__return_storage_ptr__,(ulong)local_e8._M_dataplus._M_p);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_e8._M_dataplus._M_p != paVar20) {
                  operator_delete(local_e8._M_dataplus._M_p,
                                  local_e8.field_2._M_allocated_capacity + 1);
                }
                std::__cxx11::string::append((char *)__return_storage_ptr__);
                snprintf((char *)&local_e8,0x11,"%016llx",(pVVar28->value).i64);
                std::__cxx11::string::append((char *)__return_storage_ptr__);
                break;
              case VK_PIPELINE_EXECUTABLE_STATISTIC_FORMAT_FLOAT64_KHR:
                __gnu_cxx::__to_xstring<std::__cxx11::string,char>
                          (&local_e8,vsnprintf,0x148,"%f",(pVVar28->value).i64);
                std::__cxx11::string::_M_append
                          ((char *)__return_storage_ptr__,(ulong)local_e8._M_dataplus._M_p);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_e8._M_dataplus._M_p != paVar20) {
                  operator_delete(local_e8._M_dataplus._M_p,
                                  local_e8.field_2._M_allocated_capacity + 1);
                }
                break;
              default:
                std::__cxx11::string::append((char *)__return_storage_ptr__);
              }
              psVar16 = (string *)std::__cxx11::string::append((char *)__return_storage_ptr__);
              pVVar28 = pVVar28 + 1;
            } while (pVVar28 != pVVar26);
          }
          if (local_88.
              super__Vector_base<VkPipelineExecutableStatisticKHR,_std::allocator<VkPipelineExecutableStatisticKHR>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_88.
                            super__Vector_base<VkPipelineExecutableStatisticKHR,_std::allocator<VkPipelineExecutableStatisticKHR>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_88.
                                  super__Vector_base<VkPipelineExecutableStatisticKHR,_std::allocator<VkPipelineExecutableStatisticKHR>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_88.
                                  super__Vector_base<VkPipelineExecutableStatisticKHR,_std::allocator<VkPipelineExecutableStatisticKHR>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
            psVar16 = extraout_RAX_05;
          }
          if (local_a8.ptr != (Variant *)0x0) {
            operator_delete(local_a8.ptr,local_98 - (long)local_a8.ptr);
            psVar16 = extraout_RAX_06;
          }
          goto joined_r0x0013a5a9;
        }
LAB_0013a650:
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)__return_storage_ptr__,"// Could not find stage in compiled pipeline.",
                   "");
        psVar16 = extraout_RAX_02;
      }
      else {
        psVar16 = (string *)&__return_storage_ptr__->field_2;
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)psVar16;
        __return_storage_ptr__->_M_string_length = 0;
        (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
      }
    }
    else {
      if (device->amd_shader_info != true) goto LAB_0013a5b9;
      local_e8._M_dataplus._M_p = (pointer)0x0;
      VVar11 = (*vkGetShaderInfoAMD)
                         (device->device,pipeline,stage,VK_SHADER_INFO_TYPE_DISASSEMBLY_AMD,
                          (size_t *)&local_e8,(void *)0x0);
      if (VVar11 != VK_SUCCESS) {
        disassemble_spirv_abi_cxx11_();
        return extraout_RAX_03;
      }
      std::vector<char,_std::allocator<char>_>::vector
                ((vector<char,_std::allocator<char>_> *)local_c8,
                 (size_type)local_e8._M_dataplus._M_p,(allocator_type *)&local_58);
      VVar11 = (*vkGetShaderInfoAMD)
                         (device->device,pipeline,stage,VK_SHADER_INFO_TYPE_DISASSEMBLY_AMD,
                          (size_t *)&local_e8,(void *)local_c8._0_8_);
      if (VVar11 == VK_SUCCESS) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        std::__cxx11::string::
        _M_construct<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
                  ((string *)__return_storage_ptr__,local_c8._0_8_,local_c8._8_8_);
        psVar16 = extraout_RAX_00;
        local_70.
        super__Vector_base<VkPipelineExecutablePropertiesKHR,_std::allocator<VkPipelineExecutablePropertiesKHR>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)local_c8._0_8_;
        local_70.
        super__Vector_base<VkPipelineExecutablePropertiesKHR,_std::allocator<VkPipelineExecutablePropertiesKHR>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_b8._0_8_;
      }
      else {
        disassemble_spirv_abi_cxx11_();
        psVar16 = extraout_RAX_04;
        local_70.
        super__Vector_base<VkPipelineExecutablePropertiesKHR,_std::allocator<VkPipelineExecutablePropertiesKHR>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)local_c8._0_8_;
        local_70.
        super__Vector_base<VkPipelineExecutablePropertiesKHR,_std::allocator<VkPipelineExecutablePropertiesKHR>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_b8._0_8_;
      }
    }
joined_r0x0013a5a9:
    if (local_70.
        super__Vector_base<VkPipelineExecutablePropertiesKHR,_std::allocator<VkPipelineExecutablePropertiesKHR>_>
        ._M_impl.super__Vector_impl_data._M_start == (VkPipelineExecutablePropertiesKHR *)0x0) {
      return psVar16;
    }
    pVVar24 = (VkPipeline)
              ((long)local_70.
                     super__Vector_base<VkPipelineExecutablePropertiesKHR,_std::allocator<VkPipelineExecutablePropertiesKHR>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage -
              (long)local_70.
                    super__Vector_base<VkPipelineExecutablePropertiesKHR,_std::allocator<VkPipelineExecutablePropertiesKHR>_>
                    ._M_impl.super__Vector_impl_data._M_start);
LAB_0013ae54:
    operator_delete(local_70.
                    super__Vector_base<VkPipelineExecutablePropertiesKHR,_std::allocator<VkPipelineExecutablePropertiesKHR>_>
                    ._M_impl.super__Vector_impl_data._M_start,(ulong)pVVar24);
    return extraout_RAX_07;
  }
  if (method != GLSL) {
    if (method != Asm) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
      return extraout_RAX;
    }
    local_c8._8_8_ = (pointer)0x0;
    local_b8._0_8_ = local_b8._0_8_ & 0xffffffffffffff00;
    local_c8._0_8_ = (VkPipelineExecutablePropertiesKHR *)local_b8;
    spvtools::SpirvTools::SpirvTools((SpirvTools *)&local_e8,SPV_ENV_VULKAN_1_2);
    bVar9 = spvtools::SpirvTools::Disassemble
                      ((SpirvTools *)&local_e8,module_create_info->pCode,
                       module_create_info->codeSize >> 2,(string *)local_c8,0x40);
    pVVar18 = (VkPipelineExecutablePropertiesKHR *)&__return_storage_ptr__->field_2;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)pVVar18;
    if (bVar9) {
      if ((VkPipelineExecutablePropertiesKHR *)local_c8._0_8_ ==
          (VkPipelineExecutablePropertiesKHR *)local_b8) {
        *(undefined8 *)pVVar18 = local_b8._0_8_;
        *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_b8._8_8_;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_c8._0_8_;
        (__return_storage_ptr__->field_2)._M_allocated_capacity = local_b8._0_8_;
      }
      psVar14 = (size_type *)(local_c8 + 8);
      __return_storage_ptr__->_M_string_length = local_c8._8_8_;
      pVVar18 = (VkPipelineExecutablePropertiesKHR *)local_b8;
      local_c8._0_8_ = (VkPipelineExecutablePropertiesKHR *)local_b8;
    }
    else {
      psVar14 = &__return_storage_ptr__->_M_string_length;
    }
    *psVar14 = 0;
    ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      *)&pVVar18->sType)->_M_local_buf[0] = '\0';
    spvtools::SpirvTools::~SpirvTools((SpirvTools *)&local_e8);
    if ((VkPipelineExecutablePropertiesKHR *)local_c8._0_8_ ==
        (VkPipelineExecutablePropertiesKHR *)local_b8) {
      return extraout_RAX_01;
    }
    pVVar24 = (VkPipeline)(local_b8._0_8_ + 1);
    local_70.
    super__Vector_base<VkPipelineExecutablePropertiesKHR,_std::allocator<VkPipelineExecutablePropertiesKHR>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)local_c8._0_8_;
    goto LAB_0013ae54;
  }
  sVar10 = spvc_context_create((spvc_context *)local_c8);
  if (sVar10 != SPVC_SUCCESS) goto switchD_0013a304_caseD_3;
  sVar10 = spvc_context_parse_spirv
                     ((spvc_context)local_c8._0_8_,module_create_info->pCode,
                      module_create_info->codeSize >> 2,(spvc_parsed_ir *)&local_e8);
  if (((sVar10 == SPVC_SUCCESS) &&
      (sVar10 = spvc_context_create_compiler
                          ((spvc_context)local_c8._0_8_,SPVC_BACKEND_GLSL,
                           (spvc_parsed_ir)local_e8._M_dataplus._M_p,
                           SPVC_CAPTURE_MODE_TAKE_OWNERSHIP,(spvc_compiler *)&local_58),
      sVar10 == SPVC_SUCCESS)) &&
     (sVar10 = spvc_compiler_create_compiler_options
                         ((spvc_compiler)local_58._0_8_,(spvc_compiler_options *)&local_70),
     sVar10 == SPVC_SUCCESS)) {
    spvc_compiler_options_set_uint
              ((spvc_compiler_options)
               local_70.
               super__Vector_base<VkPipelineExecutablePropertiesKHR,_std::allocator<VkPipelineExecutablePropertiesKHR>_>
               ._M_impl.super__Vector_impl_data._M_start,SPVC_COMPILER_OPTION_GLSL_VERSION,0x1cc);
    model = SpvExecutionModelVertex;
    spvc_compiler_options_set_bool
              ((spvc_compiler_options)
               local_70.
               super__Vector_base<VkPipelineExecutablePropertiesKHR,_std::allocator<VkPipelineExecutablePropertiesKHR>_>
               ._M_impl.super__Vector_impl_data._M_start,SPVC_COMPILER_OPTION_GLSL_ES,'\0');
    spvc_compiler_options_set_bool
              ((spvc_compiler_options)
               local_70.
               super__Vector_base<VkPipelineExecutablePropertiesKHR,_std::allocator<VkPipelineExecutablePropertiesKHR>_>
               ._M_impl.super__Vector_impl_data._M_start,SPVC_COMPILER_OPTION_GLSL_VULKAN_SEMANTICS,
               '\x01');
    spvc_compiler_install_compiler_options
              ((spvc_compiler)local_58._0_8_,
               (spvc_compiler_options)
               local_70.
               super__Vector_base<VkPipelineExecutablePropertiesKHR,_std::allocator<VkPipelineExecutablePropertiesKHR>_>
               ._M_impl.super__Vector_impl_data._M_start);
    if (entry_point != (char *)0x0) {
      if ((int)stage < 0x80) {
        if ((int)stage < 0x10) {
          switch(stage) {
          case VK_SHADER_STAGE_VERTEX_BIT:
            break;
          case VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT:
            model = SpvExecutionModelTessellationControl;
            break;
          default:
            goto switchD_0013a304_caseD_3;
          case VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT:
            model = SpvExecutionModelTessellationEvaluation;
            break;
          case VK_SHADER_STAGE_GEOMETRY_BIT:
            model = SpvExecutionModelGeometry;
          }
        }
        else if (stage == VK_SHADER_STAGE_FRAGMENT_BIT) {
          model = SpvExecutionModelFragment;
        }
        else if (stage == VK_SHADER_STAGE_COMPUTE_BIT) {
          model = SpvExecutionModelGLCompute;
        }
        else {
          if (stage != VK_SHADER_STAGE_TASK_BIT_EXT) goto switchD_0013a304_caseD_3;
          model = SpvExecutionModelTaskEXT;
        }
      }
      else if ((int)stage < 0x400) {
        if (stage == VK_SHADER_STAGE_MESH_BIT_EXT) {
          model = SpvExecutionModelMeshEXT;
        }
        else if (stage == VK_SHADER_STAGE_RAYGEN_BIT_KHR) {
          model = SpvExecutionModelRayGenerationKHR;
        }
        else {
          if (stage != VK_SHADER_STAGE_ANY_HIT_BIT_KHR) goto switchD_0013a304_caseD_3;
          model = SpvExecutionModelAnyHitKHR;
        }
      }
      else if ((int)stage < 0x1000) {
        if (stage == VK_SHADER_STAGE_CLOSEST_HIT_BIT_KHR) {
          model = SpvExecutionModelClosestHitKHR;
        }
        else {
          if (stage != VK_SHADER_STAGE_MISS_BIT_KHR) goto switchD_0013a304_caseD_3;
          model = SpvExecutionModelMissKHR;
        }
      }
      else if (stage == VK_SHADER_STAGE_INTERSECTION_BIT_KHR) {
        model = SpvExecutionModelIntersectionKHR;
      }
      else {
        if (stage != VK_SHADER_STAGE_CALLABLE_BIT_KHR) goto switchD_0013a304_caseD_3;
        model = SpvExecutionModelCallableKHR;
      }
      spvc_compiler_set_entry_point((spvc_compiler)local_58._0_8_,entry_point,model);
    }
    sVar10 = spvc_compiler_compile((spvc_compiler)local_58._0_8_,(char **)&local_a8);
    if (sVar10 == SPVC_SUCCESS) {
      std::__cxx11::string::string
                ((string *)__return_storage_ptr__,(char *)local_a8.ptr,(allocator *)&local_88);
      spvc_context_destroy((spvc_context)local_c8._0_8_);
      return extraout_RAX_08;
    }
  }
  spvc_context_destroy((spvc_context)local_c8._0_8_);
switchD_0013a304_caseD_3:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  (__return_storage_ptr__->field_2)._M_allocated_capacity = 0x656c696146202f2f;
  *(undefined2 *)((long)&__return_storage_ptr__->field_2 + 8) = 100;
  __return_storage_ptr__->_M_string_length = 9;
  return (string *)0x656c696146202f2f;
code_r0x0013a641:
  uVar12 = uVar12 + 1;
  paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)((long)paVar20 + 0x218);
  if (local_ec == uVar12) goto LAB_0013a650;
  goto LAB_0013a63c;
}

Assistant:

static string disassemble_spirv(const VulkanDevice &device, VkPipeline pipeline,
                                DisasmMethod method, VkShaderStageFlagBits stage,
                                const VkShaderModuleCreateInfo *module_create_info, const char *entry_point)
{
	switch (method)
	{
	case DisasmMethod::Asm:
		return disassemble_spirv_asm(module_create_info);

	case DisasmMethod::GLSL:
		return disassemble_spirv_glsl(module_create_info, entry_point, stage);

	case DisasmMethod::ISA:
		return disassemble_spirv_isa(device, pipeline, stage);

	default:
		return "";
	}
}